

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync_tests.cpp
# Opt level: O1

void (anonymous_namespace)::TestInconsistentLockOrderDetected<AnnotatedMixin<std::mutex>>
               (AnnotatedMixin<std::mutex> *mutex1,AnnotatedMixin<std::mutex> *mutex2)

{
  int iVar1;
  undefined8 uVar2;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  string lockname;
  check_type cVar3;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  assertion_result local_78;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  lazy_ostream local_40;
  _func_int *local_30;
  char **local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)mutex1);
  if (iVar1 == 0) {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)mutex2);
    if (iVar1 == 0) {
      local_40.m_empty = false;
      local_40._9_7_ = 0;
      local_30 = (_func_int *)((ulong)local_30 & 0xffffffffffffff00);
      local_40._vptr_lazy_ostream = &local_30;
      pthread_mutex_unlock((pthread_mutex_t *)mutex2);
      if (local_40._vptr_lazy_ostream != &local_30) {
        operator_delete(local_40._vptr_lazy_ostream,(ulong)(local_30 + 1));
      }
      local_40._8_8_ = 0;
      local_30 = (_func_int *)((ulong)local_30 & 0xffffffffffffff00);
      local_40._vptr_lazy_ostream = &local_30;
      pthread_mutex_unlock((pthread_mutex_t *)mutex1);
      if (local_40._vptr_lazy_ostream != &local_30) {
        operator_delete(local_40._vptr_lazy_ostream,(ulong)(local_30 + 1));
      }
      local_50 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sync_tests.cpp"
      ;
      local_48 = "";
      local_60 = &boost::unit_test::basic_cstring<char_const>::null;
      local_58 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x4c;
      file.m_begin = (iterator)&local_50;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_60,msg);
      local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
      local_78.m_message.px = (element_type *)0x0;
      local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_28 = &local_88;
      local_88 = "LockStackEmpty()";
      local_80 = "";
      local_40._8_8_ = local_40._8_8_ & 0xffffffffffffff00;
      local_40._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
      local_30 = (_func_int *)boost::unit_test::lazy_ostream::inst;
      local_98 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sync_tests.cpp"
      ;
      local_90 = "";
      boost::test_tools::tt_detail::report_assertion
                (&local_78,&local_40,1,0,WARN,_cVar3,(size_t)&local_98,0x4c);
      boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        return;
      }
      goto LAB_0065e123;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    uVar2 = std::__throw_system_error(iVar1);
    boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      _Unwind_Resume(uVar2);
    }
  }
LAB_0065e123:
  __stack_chk_fail();
}

Assistant:

void TestInconsistentLockOrderDetected(MutexType& mutex1, MutexType& mutex2) NO_THREAD_SAFETY_ANALYSIS
{
    ENTER_CRITICAL_SECTION(mutex1);
    ENTER_CRITICAL_SECTION(mutex2);
#ifdef DEBUG_LOCKORDER
    BOOST_CHECK_EXCEPTION(LEAVE_CRITICAL_SECTION(mutex1), std::logic_error, HasReason("mutex1 was not most recent critical section locked"));
#endif // DEBUG_LOCKORDER
    LEAVE_CRITICAL_SECTION(mutex2);
    LEAVE_CRITICAL_SECTION(mutex1);
    BOOST_CHECK(LockStackEmpty());
}